

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall
crnlib::symbol_codec::decode(symbol_codec *this,adaptive_bit_model *model,bool update_model)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint bit;
  uint x;
  uint c;
  bool update_model_local;
  adaptive_bit_model *model_local;
  symbol_codec *this_local;
  
  if (this->m_arith_length < 0x1000000) {
    uVar1 = get_bits(this,8);
    this->m_arith_value = this->m_arith_value << 8 | uVar1;
    this->m_arith_length = this->m_arith_length << 8;
  }
  uVar3 = (uint)model->m_bit_0_prob * (this->m_arith_length >> 0xb);
  uVar2 = (uint)(uVar3 <= this->m_arith_value);
  if (uVar2 == 0) {
    if (update_model) {
      model->m_bit_0_prob = model->m_bit_0_prob + (short)(0x800 - model->m_bit_0_prob >> 5);
    }
    this->m_arith_length = uVar3;
  }
  else {
    if (update_model) {
      model->m_bit_0_prob = model->m_bit_0_prob - (short)((int)(uint)model->m_bit_0_prob >> 5);
    }
    this->m_arith_value = this->m_arith_value - uVar3;
    this->m_arith_length = this->m_arith_length - uVar3;
  }
  return uVar2;
}

Assistant:

uint symbol_codec::decode(adaptive_bit_model& model, bool update_model)
    {
        if (m_arith_length < cSymbolCodecArithMinLen)
        {
            uint c = get_bits(8);
            m_arith_value = (m_arith_value << 8) | c;

            m_arith_length <<= 8;
            CRNLIB_ASSERT(m_arith_length >= cSymbolCodecArithMinLen);
        }

        CRNLIB_ASSERT(m_arith_length >= cSymbolCodecArithMinLen);

        //uint x = gArithProbMulTab[model.m_bit_0_prob >> (cSymbolCodecArithProbBits - cSymbolCodecArithProbMulBits)][m_arith_length >> (32 - cSymbolCodecArithProbMulLenSigBits)] << 16;
        uint x = model.m_bit_0_prob * (m_arith_length >> cSymbolCodecArithProbBits);
        uint bit = (m_arith_value >= x);

        if (!bit)
        {
            if (update_model)
            {
                model.m_bit_0_prob += ((cSymbolCodecArithProbScale - model.m_bit_0_prob) >> cSymbolCodecArithProbMoveBits);
            }

            m_arith_length = x;
        }
        else
        {
            if (update_model)
            {
                model.m_bit_0_prob -= (model.m_bit_0_prob >> cSymbolCodecArithProbMoveBits);
            }

            m_arith_value -= x;
            m_arith_length -= x;
        }

        return bit;
    }